

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void y_structure_suite::y_structure_string_empty(void)

{
  char input [3];
  reader reader;
  undefined4 local_180;
  char local_17c [4];
  return_type local_178;
  basic_reader<char> local_158;
  
  local_17c[2] = 0;
  local_17c[0] = '\"';
  local_17c[1] = '\"';
  local_178._M_dataplus._M_p = (pointer)strlen(local_17c);
  local_178._M_string_length = (size_type)local_17c;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_178);
  local_180 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x1033,"void y_structure_suite::y_structure_string_empty()",&local_178,&local_180);
  trial::protocol::json::basic_reader<char>::
  overloader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::value(&local_178,&local_158);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[1]>
            ("reader.value<std::string>()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x1034,"void y_structure_suite::y_structure_string_empty()",&local_178,"");
  std::__cxx11::string::~string((string *)&local_178);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_178._M_dataplus._M_p._0_4_ = local_158.decoder.current.code;
  local_180 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x1036,"void y_structure_suite::y_structure_string_empty()",&local_178,&local_180);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void y_structure_string_empty()
{
    const char input[] = "\"\"";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}